

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_false,_true>_>_>
::_insert_chain(Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_false,_true>_>_>
                *this,Tmp_column *column,Dimension dimension,Index pair)

{
  Column *pCVar1;
  
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,false,true>>>
  ::_container_insert<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>
            ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,false,true>>>
              *)this,column,this->nextIndex_,dimension);
  pCVar1 = get_column(this,this->nextIndex_);
  (pCVar1->super_Chain_column_option).pairedColumn_ = pair;
  pCVar1 = get_column(this,pair);
  (pCVar1->super_Chain_column_option).pairedColumn_ = this->nextIndex_;
  _update_barcode(this,pair);
  this->nextIndex_ = this->nextIndex_ + 1;
  return;
}

Assistant:

inline void Chain_matrix<Master_matrix>::_insert_chain(const Tmp_column& column, Dimension dimension, Index pair)
{
  // true when no vine updates and if nextIndex_ is updated in remove_last for special case of no vines
  // because then @ref PosIdx == @ref MatIdx
  Pos_index pairPos = pair;

  _container_insert(column, nextIndex_, dimension);

  get_column(nextIndex_).assign_paired_chain(pair);
  auto& pairCol = get_column(pair);
  pairCol.assign_paired_chain(nextIndex_);

  if constexpr (Master_matrix::Option_list::has_column_pairings && Master_matrix::Option_list::has_vine_update) {
    pairPos = Swap_opt::CP::pivotToPosition_[pairCol.get_pivot()];
  }

  _update_barcode(pairPos);

  ++nextIndex_;
}